

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags flags)

{
  char *buf;
  float fVar1;
  ImVec2 IVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *window_00;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  IVar2 = (pIVar4->ContentRegionRect).Max;
  if (((pIVar4->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
     (GImGui->CurrentTable != (ImGuiTable *)0x0)) {
    IVar2.y = IVar2.y;
    IVar2.x = (pIVar4->WorkRect).Max.x;
  }
  auVar8._8_8_ = 0;
  auVar8._0_4_ = IVar2.x;
  auVar8._4_4_ = IVar2.y;
  uVar3 = pIVar4->Flags;
  auVar9._0_4_ = (int)(*size_arg).x;
  auVar9._4_4_ = (int)(*size_arg).y;
  auVar9._8_8_ = 0;
  auVar10 = vcvtdq2ps_avx(auVar9);
  if (auVar9._0_4_ < 1) {
    auVar5 = vmaxss_avx(ZEXT416((uint)((IVar2.x - (pIVar4->DC).CursorPos.x) + auVar10._0_4_)),
                        ZEXT416(0x40800000));
    auVar10._4_12_ = auVar10._4_12_;
    auVar10._0_4_ = auVar5._0_4_;
  }
  auVar5 = vmovshdup_avx(auVar10);
  if (auVar5._0_4_ <= 0.0) {
    auVar8 = vmovshdup_avx(auVar8);
    auVar8 = vmaxss_avx(ZEXT416((uint)((auVar8._0_4_ - (pIVar4->DC).CursorPos.y) + auVar5._0_4_)),
                        ZEXT416(0x40800000));
    auVar10 = vinsertps_avx(auVar10,auVar8,0x10);
  }
  *(byte *)&(GImGui->NextWindowData).Flags = (byte)(GImGui->NextWindowData).Flags | 2;
  IVar2 = (ImVec2)vmovlps_avx(auVar10);
  (pIVar6->NextWindowData).SizeVal = IVar2;
  (pIVar6->NextWindowData).SizeCond = 1;
  buf = pIVar6->TempBuffer;
  if (name == (char *)0x0) {
    ImFormatString(buf,0xc01,"%s/%08X",pIVar4->Name,(ulong)id);
  }
  else {
    ImFormatString(buf,0xc01,"%s/%s_%08X",pIVar4->Name,name);
  }
  fVar1 = (pIVar6->Style).ChildBorderSize;
  if (!border) {
    (pIVar6->Style).ChildBorderSize = 0.0;
  }
  bVar7 = Begin(buf,(bool *)0x0,uVar3 & 4 | flags | 0x1000103);
  (pIVar6->Style).ChildBorderSize = fVar1;
  window_00 = pIVar6->CurrentWindow;
  window_00->ChildId = id;
  window_00->AutoFitChildAxises = (auVar9._4_4_ == 0) * '\x02' + (auVar9._0_4_ == 0);
  if (window_00->BeginCount == 1) {
    (pIVar4->DC).CursorPos = window_00->Pos;
  }
  if (((((uint)flags >> 0x17 & 1) == 0) && (pIVar6->NavActivateId == id)) &&
     (((window_00->DC).NavLayerActiveMask != 0 || ((window_00->DC).NavHasScroll == true)))) {
    FocusWindow(window_00);
    NavInitWindow(window_00,false);
    SetActiveID(id + 1,window_00);
    pIVar6->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar7;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    if (name)
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(g.TempBuffer, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id + 1, child_window); // Steal ActiveId with another arbitrary id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}